

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Options
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,RegexFlags *flags)

{
  EncodedChar c_00;
  bool bVar1;
  char16 c_01;
  ScriptConfiguration *pSVar2;
  Char c;
  CharCount consume;
  EncodedChar ec;
  RegexFlags *flags_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  do {
    c_00 = ECLookahead(this,0);
    if (c_00 == '\0') {
      return;
    }
    c_01 = Chars<unsigned_char>::CTW(c_00);
    switch(c_01) {
    case L'g':
      if ((*flags & GlobalRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | GlobalRegexFlag;
      break;
    default:
      goto switchD_015ab9b0_caseD_68;
    case L'i':
      if ((*flags & IgnoreCaseRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | IgnoreCaseRegexFlag;
      break;
    case L'm':
      if ((*flags & MultilineRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | MultilineRegexFlag;
      break;
    case L's':
      pSVar2 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar1 = Js::ScriptConfiguration::IsES2018RegExDotAllEnabled(pSVar2);
      if (!bVar1) goto switchD_015ab9b0_caseD_75;
      if ((*flags & DotAllRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | DotAllRegexFlag;
      break;
    case L'u':
switchD_015ab9b0_caseD_75:
      pSVar2 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar1 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar2);
      if (!bVar1) goto switchD_015ab9b0_caseD_79;
      if ((*flags & UnicodeRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | UnicodeRegexFlag;
      break;
    case L'y':
switchD_015ab9b0_caseD_79:
      pSVar2 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar1 = Js::ScriptConfiguration::IsES6RegExStickyEnabled(pSVar2);
      if (!bVar1) {
switchD_015ab9b0_caseD_68:
        bVar1 = StandardChars<char16_t>::IsWord(this->standardChars,c_01);
        if (!bVar1) {
          return;
        }
        Fail(this,-0x7ff5ec67);
        return;
      }
      if ((*flags & StickyRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | StickyRegexFlag;
    }
    ECConsume(this,1);
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }